

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofHasBits
          (MessageGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  bool bVar3;
  size_type sVar4;
  long lVar5;
  Iterator __begin3;
  string out;
  Formatter format;
  Iterator __end3;
  string local_c8;
  Iterator local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Formatter local_78;
  Iterator local_40;
  
  local_78.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_78.vars_._M_t,&(this->variables_)._M_t);
  local_a8.descriptor = this->descriptor_;
  local_a8.idx = 0;
  local_40.idx = *(int *)(local_a8.descriptor + 0x6c);
  paVar1 = &local_c8.field_2;
  local_40.descriptor = local_a8.descriptor;
  while( true ) {
    bVar3 = operator==(&local_a8,&local_40);
    if (bVar3) break;
    lVar5 = (long)local_a8.idx * 0x28 + *(long *)(local_a8.descriptor + 0x30);
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"oneof_name","");
    Formatter::Set<std::__cxx11::string>
              (&local_78,&local_c8,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar5 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"oneof_index","");
    local_98._M_dataplus._M_p._0_4_ =
         (int)((ulong)(lVar5 - *(long *)(*(long *)(lVar5 + 0x10) + 0x30)) >> 3) * -0x33333333;
    Formatter::Set<int>(&local_78,&local_c8,(int *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"cap_oneof_name","");
    lVar2 = **(long **)(lVar5 + 8);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,lVar2,(*(long **)(lVar5 + 8))[1] + lVar2);
    if (local_98._M_string_length != 0) {
      sVar4 = 0;
      do {
        if ((byte)(local_98._M_dataplus._M_p[sVar4] + 0x9fU) < 0x1a) {
          local_98._M_dataplus._M_p[sVar4] = local_98._M_dataplus._M_p[sVar4] + -0x20;
        }
        sVar4 = sVar4 + 1;
      } while (local_98._M_string_length != sVar4);
    }
    Formatter::Set<std::__cxx11::string>(&local_78,&local_c8,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    Formatter::operator()<>
              (&local_78,
               "inline bool $classname$::has_$oneof_name$() const {\n  return $oneof_name$_case() != $cap_oneof_name$_NOT_SET;\n}\ninline void $classname$::clear_has_$oneof_name$() {\n  _oneof_case_[$oneof_index$] = $cap_oneof_name$_NOT_SET;\n}\n"
              );
    local_a8.idx = local_a8.idx + 1;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_78.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateOneofHasBits(io::Printer* printer) {
  Formatter format(printer, variables_);
  for (auto oneof : OneOfRange(descriptor_)) {
    format.Set("oneof_name", oneof->name());
    format.Set("oneof_index", oneof->index());
    format.Set("cap_oneof_name", ToUpper(oneof->name()));
    format(
        "inline bool $classname$::has_$oneof_name$() const {\n"
        "  return $oneof_name$_case() != $cap_oneof_name$_NOT_SET;\n"
        "}\n"
        "inline void $classname$::clear_has_$oneof_name$() {\n"
        "  _oneof_case_[$oneof_index$] = $cap_oneof_name$_NOT_SET;\n"
        "}\n");
  }
}